

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

void __thiscall
Table::insert_into(Table *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *fields)

{
  iterator __position;
  bool bVar1;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_00;
  size_t sVar2;
  vector<long,std::allocator<long>> *this_01;
  runtime_error *prVar3;
  long lVar4;
  pointer pbVar5;
  long lVar6;
  ulong uVar7;
  char *__s;
  long record_number;
  fstream f;
  Record r;
  long local_408;
  Index *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8 [16];
  Record local_1c8;
  
  pbVar5 = (fields->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(fields->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar6 = 0;
    do {
      if (0x13 < *(ulong *)((long)&pbVar5->_M_string_length + lVar6)) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_3d8,this->MAX_FIELD_SIZE_EXCEEDED,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(((fields->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6));
        std::runtime_error::runtime_error(prVar3,(string *)local_3d8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar6 = lVar6 + 0x20;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  get_filename_abi_cxx11_(local_3d8,this);
  bVar1 = bin_io::file_exists(local_3d8[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
    operator_delete(local_3d8[0]._M_dataplus._M_p);
  }
  if (bVar1) {
    std::fstream::fstream(local_3d8);
    get_filename_abi_cxx11_((string *)&local_1c8,this);
    bin_io::open_fileW((fstream *)local_3d8,(char *)local_1c8._0_8_);
    if ((char *)local_1c8._0_8_ != local_1c8.buffer[0] + 0xc) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if ((long)(fields->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(fields->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(this->columns).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->columns).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      Record::Record(&local_1c8);
      Record::create_from_vector(&local_1c8,fields);
      local_408 = Record::append_to_file(&local_1c8,(fstream *)local_3d8);
      pbVar5 = (this->columns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->columns).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
        local_400 = &this->index;
        __s = (char *)((long)&local_1c8 + 4);
        lVar4 = 0;
        uVar7 = 0;
        do {
          this_00 = Index::operator[](local_400,
                                      (string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar4));
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,__s,__s + sVar2);
          this_01 = (vector<long,std::allocator<long>> *)
                    MultiMap::
                    MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                    ::at(this_00,&local_3f8);
          __position._M_current = *(long **)(this_01 + 8);
          if (__position._M_current == *(long **)(this_01 + 0x10)) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (this_01,__position,&local_408);
          }
          else {
            *__position._M_current = local_408;
            *(long **)(this_01 + 8) = __position._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          uVar7 = uVar7 + 1;
          pbVar5 = (this->columns).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __s = __s + 0x14;
          lVar4 = lVar4 + 0x20;
        } while (uVar7 < (ulong)((long)(this->columns).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                                5));
      }
      std::fstream::close();
      std::fstream::~fstream(local_3d8);
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,this->MISMATCHED_COL_NUM);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,this->CANNOT_FIND_TABLE);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Table::insert_into(const std::vector<std::string>& fields) {
    // check field lengths, because the technology isnt here for this yet
    for (size_t i = 0; i < fields.size(); ++i) {
        if (fields[i].size() >= constants::MAX_BLOCK_COLS)
            throw std::runtime_error(MAX_FIELD_SIZE_EXCEEDED + fields[i]);
    }
    if(!bin_io::file_exists(get_filename().c_str()))
        throw std::runtime_error(CANNOT_FIND_TABLE);
    std::fstream f;
    bin_io::open_fileW(f, get_filename().c_str());
    if (fields.size() != columns.size()) {
        throw std::runtime_error(MISMATCHED_COL_NUM);
    }
    Record r;
    r.create_from_vector(fields);
    long record_number = r.append_to_file(f);
    // update the index
    for (size_t i = 0; i < columns.size(); ++i) {
        index[columns[i]][r.buffer[i]] += record_number;
    }
    f.close();
}